

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

void __thiscall
Image::drawOnto(Image *this,Image *image,Point point,
               vector<MaskRect,_std::allocator<MaskRect>_> *sections)

{
  ushort uVar1;
  pointer pMVar2;
  runtime_error *prVar3;
  ushort uVar4;
  ulong uVar5;
  pointer pMVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pMVar6 = (sections->super__Vector_base<MaskRect,_std::allocator<MaskRect>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar2 = (sections->super__Vector_base<MaskRect,_std::allocator<MaskRect>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pMVar6 == pMVar2) {
      return;
    }
    uVar1 = pMVar6->x2;
    uVar7 = (uint)uVar1;
    if (((this->size).width < (int)(uint)uVar1) ||
       (uVar4 = pMVar6->y2, (this->size).height < (int)(uint)uVar4)) break;
    if (((image->size).width < (int)((uint)uVar1 + point.x)) ||
       ((image->size).height < (int)((uint)uVar4 + point.y))) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Failed assertion ",&local_71);
      std::operator+(&local_50,&local_70,
                     "point.x + section.x2 <= image.size.width && point.y + section.y2 <= image.size.height"
                    );
      std::runtime_error::runtime_error(prVar3,(string *)&local_50);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar9 = point.y + (uint)pMVar6->y1;
    for (uVar8 = (uint)pMVar6->y1; uVar8 < uVar4; uVar8 = uVar8 + 1) {
      for (uVar5 = (ulong)pMVar6->x1; (uint)uVar5 < uVar7; uVar5 = uVar5 + 1) {
        (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
        super__Vector_impl_data._M_start[(int)((image->size).width * iVar9 + point.x + (uint)uVar5)]
             = (this->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
               super__Vector_impl_data._M_start[(long)(this->size).width * (long)(int)uVar8 + uVar5]
        ;
        uVar7 = (uint)pMVar6->x2;
      }
      uVar4 = pMVar6->y2;
      iVar9 = iVar9 + 1;
    }
    pMVar6 = pMVar6 + 1;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Failed assertion ",&local_71);
  std::operator+(&local_50,&local_70,"section.x2 <= size.width && section.y2 <= size.height");
  std::runtime_error::runtime_error(prVar3,(string *)&local_50);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Image::drawOnto(Image &image, Point point, std::vector<MaskRect> sections) const {
	for (const auto& section : sections) {
		throwing_assert(section.x2 <= size.width && section.y2 <= size.height);
		throwing_assert(point.x + section.x2 <= image.size.width && point.y + section.y2 <= image.size.height);
		for (int y = section.y1; y < section.y2; y++) {
			for (int x = section.x1; x < section.x2; x++) {
				image.pixel(x + point.x, y + point.y) = this->pixel(x, y);
			}
		}
	}
}